

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimulationDecPOMDPDiscrete.h
# Opt level: O0

SimulationResult * __thiscall
SimulationDecPOMDPDiscrete::RunSimulations<AgentFullyObservable>
          (SimulationDecPOMDPDiscrete *this,
          vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_> *agents)

{
  undefined8 uVar1;
  value_type pAVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  size_type sVar6;
  DecPOMDPDiscreteInterface *pDVar7;
  ostream *poVar8;
  long *plVar9;
  const_reference ppAVar10;
  reference pvVar11;
  vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_> *in_RDX;
  Simulation *in_RSI;
  SimulationResult *in_RDI;
  double dVar12;
  double specialR;
  double sumR;
  double r;
  uint h;
  vector<unsigned_int,_std::allocator<unsigned_int>_> aIs;
  int i_1;
  int nr;
  Index prevSI;
  Index prevJaI;
  Index prevJoI;
  Index joI;
  Index sI;
  Index jaI;
  int i;
  SimulationResult *result;
  undefined4 in_stack_fffffffffffffe94;
  allocator_type *in_stack_fffffffffffffea0;
  uint in_stack_fffffffffffffea8;
  value_type in_stack_fffffffffffffeac;
  ostream *in_stack_fffffffffffffeb0;
  string local_d0 [32];
  string local_b0 [32];
  double local_90;
  double local_88;
  double local_80;
  uint local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_70;
  uint local_54;
  int local_50;
  Index local_4c;
  Index local_48;
  Index local_44;
  Index local_40;
  uint local_3c;
  Index local_38;
  int local_28;
  undefined1 local_21;
  vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_> *local_20;
  
  local_21 = 0;
  uVar1 = *(undefined8 *)(in_RSI + 0x20);
  local_20 = in_RDX;
  iVar4 = Simulation::GetRandomSeed(in_RSI);
  iVar5 = Simulation::GetNrRuns(in_RSI);
  SimulationResult::SimulationResult(in_RDI,(int)uVar1,iVar4,iVar5);
  for (local_28 = 0; iVar4 = local_28, iVar5 = Simulation::GetNrRuns(in_RSI), iVar4 < iVar5;
      local_28 = local_28 + 1) {
    sVar6 = std::vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>::size
                      (local_20);
    local_50 = (int)sVar6;
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x107e04);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffeb0,
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
               in_stack_fffffffffffffea0);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x107e2a);
    local_80 = 0.0;
    local_88 = 0.0;
    pDVar7 = PlanningUnitDecPOMDPDiscrete::GetDPOMDPD
                       (*(PlanningUnitDecPOMDPDiscrete **)(in_RSI + 0x18));
    local_3c = (**(code **)(*(long *)(pDVar7 + *(long *)(*(long *)pDVar7 + -0xb8)) + 0x160))
                         (pDVar7 + *(long *)(*(long *)pDVar7 + -0xb8));
    bVar3 = Simulation::GetVerbose(in_RSI);
    if (bVar3) {
      poVar8 = std::operator<<((ostream *)&std::cout,
                               "Simulation::RunSimulation set initial state to ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_3c);
      poVar8 = std::operator<<(poVar8," ");
      pDVar7 = PlanningUnitDecPOMDPDiscrete::GetDPOMDPD
                         (*(PlanningUnitDecPOMDPDiscrete **)(in_RSI + 0x18));
      plVar9 = (long *)(**(code **)(*(long *)(pDVar7 + *(long *)(*(long *)pDVar7 + -0xb8)) + 0x38))
                                 (pDVar7 + *(long *)(*(long *)pDVar7 + -0xb8),local_3c);
      (**(code **)(*plVar9 + 0x18))(local_b0);
      poVar8 = std::operator<<(poVar8,local_b0);
      poVar8 = std::operator<<(poVar8," (avg reward so far ");
      dVar12 = SimulationResult::GetAvgReward(in_RDI);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,dVar12);
      in_stack_fffffffffffffeb0 = std::operator<<(poVar8,")");
      std::ostream::operator<<(in_stack_fffffffffffffeb0,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_b0);
    }
    for (local_54 = 0; (int)local_54 < local_50; local_54 = local_54 + 1) {
      ppAVar10 = std::vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>::
                 operator[](local_20,(long)(int)local_54);
      pAVar2 = *ppAVar10;
      (**(code **)(*(long *)(pAVar2 + *(long *)(*(long *)pAVar2 + -0x18)) + 0x30))
                (pAVar2 + *(long *)(*(long *)pAVar2 + -0x18));
    }
    local_40 = 0x7fffffff;
    local_38 = 0x7fffffff;
    local_44 = 0x7fffffff;
    local_48 = 0x7fffffff;
    local_4c = 0x7fffffff;
    for (local_78 = 0; (ulong)local_78 < *(ulong *)(in_RSI + 0x20); local_78 = local_78 + 1) {
      PreActHook((SimulationDecPOMDPDiscrete *)in_RSI,local_20,local_38,local_40,local_80,local_44,
                 local_3c,local_48,local_4c,local_78);
      local_90 = 0.0;
      for (local_54 = 0; (int)local_54 < local_50; local_54 = local_54 + 1) {
        in_stack_fffffffffffffeac =
             SimulationDecPOMDPDiscrete::GetAction
                       ((vector *)in_RSI,(uint)local_20,local_54,local_38,local_80,local_40,local_44
                        ,local_3c,(double *)CONCAT44(in_stack_fffffffffffffe94,local_48));
        pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (&local_70,(long)(int)local_54);
        *pvVar11 = in_stack_fffffffffffffeac;
      }
      in_stack_fffffffffffffea8 =
           (**(code **)(**(long **)(in_RSI + 0x18) + 0x48))(*(long **)(in_RSI + 0x18),&local_70);
      local_44 = local_40;
      local_4c = local_3c;
      local_48 = in_stack_fffffffffffffea8;
      local_38 = in_stack_fffffffffffffea8;
      SimulationDecPOMDPDiscrete::Step
                ((uint)in_RSI,in_stack_fffffffffffffea8,(uint *)(ulong)local_78,&local_3c,
                 (double *)&local_40,&local_80,local_90);
    }
    SimulationResult::AddReward(local_88);
    if (((byte)in_RSI[0x28] & 1) != 0) {
      std::__cxx11::string::string(local_d0,(string *)(in_RSI + 0x30));
      SimulationResult::Save(in_RDI,local_d0);
      std::__cxx11::string::~string(local_d0);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffea0);
  }
  return in_RDI;
}

Assistant:

SimulationResult
    RunSimulations(const std::vector<A*> &agents) const
    {
        SimulationResult result(_m_horizon,GetRandomSeed(),GetNrRuns());

        // Run the simulations
        int i;
        for(i=0;i<GetNrRuns();i++)
        {
            Index jaI,sI,joI,prevJoI,prevJaI,prevSI;
            int nr=agents.size(),i;
            std::vector<Index> aIs(nr);

            unsigned int h;
            double r=0,sumR=0,specialR;

            sI = _m_pu->GetDPOMDPD()->SampleInitialState();

            if(GetVerbose())
                std::cout << "Simulation::RunSimulation set initial state to " 
                     << sI << " "
                     << _m_pu->GetDPOMDPD()->GetState(sI)->SoftPrintBrief()
                     << " (avg reward so far " << result.GetAvgReward()
                          << ")" << std::endl;

            for(i=0;i<nr;++i)
                agents[i]->ResetEpisode();

            joI=INT_MAX;
            jaI=INT_MAX;
            prevJoI=INT_MAX;
            prevJaI=INT_MAX;
            prevSI=INT_MAX;
            for(h=0;h<_m_horizon;h++)
            {
                PreActHook(agents,jaI,joI,r,prevJoI,sI,prevJaI,prevSI,h);
                specialR=0;
                // get the action for each particular agent
                for(i=0;i<nr;++i)
                    aIs[i]=GetAction(agents,i,jaI,joI,r,prevJoI,sI,prevJaI, specialR);
                jaI=_m_pu->IndividualToJointActionIndices(aIs);

                prevJoI=joI;
                prevJaI=jaI;
                prevSI=sI;
                Step(jaI, h, sI, joI, r, sumR, specialR);
            }
            
            result.AddReward(sumR);

            if(_m_saveIntermediateResults)
                result.Save(_m_intermediateResultsFilename);
        }
        
        return(result);
    }